

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashing.c
# Opt level: O2

void sha256_hash_file_contents(char *fpath,Hash *hash)

{
  FILE *__stream;
  size_t __n;
  BYTE *__ptr;
  size_t sVar1;
  BYTE *data;
  SHA256_CTX shactx;
  
  sha256_init(&shactx);
  __stream = fopen(fpath,"r");
  if (__stream != (FILE *)0x0) {
    data = (BYTE *)0x0;
    fseek(__stream,0,2);
    __n = ftell(__stream);
    fseek(__stream,0,0);
    __ptr = (BYTE *)malloc(__n + 1);
    if (__ptr == (BYTE *)0x0) {
      __n = 0;
    }
    else {
      sVar1 = fread(__ptr,1,__n,__stream);
      if (sVar1 == __n) {
        __ptr[__n] = '\0';
        data = __ptr;
      }
      else {
        free(__ptr);
        __n = 0;
        data = (BYTE *)0x0;
      }
    }
    fclose(__stream);
    if (data != (BYTE *)0x0) {
      sha256_update(&shactx,data,__n);
      sha256_finalize_to_cstr(&shactx,hash);
      free(data);
      return;
    }
  }
  log_log(0x80,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/hashing.c"
          ,0x51,"%s: Failed to hash (sha256) file contents\n",fpath);
  abort();
}

Assistant:

void sha256_hash_file_contents(const char *fpath, Hash *hash) {

    SHA256_CTX shactx;
    sha256_init(&shactx);
    size_t len = 0;
    char *contents = fread_all_into_cstr(fpath, &len);
    if (contents) {
        sha256_update(&shactx, (const BYTE *)contents, len);
    } else {
        log_fatal("%s: Failed to hash (sha256) file contents\n", fpath);
        abort();
    }
    sha256_finalize_to_cstr(&shactx, hash);
    free(contents);
}